

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sup.c
# Opt level: O0

void supgnam(char *buf,tokthdef *tab,objnum objn)

{
  int iVar1;
  long in_RSI;
  char *in_RDI;
  toksdef sym;
  byte local_3a;
  undefined1 auStack_39 [49];
  char *local_8;
  
  if (in_RSI == 0) {
    strcpy(in_RDI,"<NO SYMBOL TABLE>");
  }
  else {
    local_8 = in_RDI;
    iVar1 = tokthfind((toktdef *)sym.toksnam._9_8_,sym.toksnam._5_4_,sym.toksnam._1_4_,
                      (toksdef *)sym._0_8_);
    if ((iVar1 == 0) &&
       (iVar1 = tokthfind((toktdef *)sym.toksnam._9_8_,sym.toksnam._5_4_,sym.toksnam._1_4_,
                          (toksdef *)sym._0_8_), iVar1 == 0)) {
      strcpy(local_8,"<UNKNOWN>");
      return;
    }
    memcpy(local_8,auStack_39,(ulong)local_3a);
    local_8[local_3a] = '\0';
  }
  return;
}

Assistant:

void supgnam(char *buf, tokthdef *tab, objnum objn)
{
    toksdef sym;
    
    if (!tab)
    {
        strcpy(buf, "<NO SYMBOL TABLE>");
        return;
    }
    
    if (tokthfind((toktdef *)tab, TOKSTOBJ, (uint)objn, &sym)
        || tokthfind((toktdef *)tab, TOKSTFWDOBJ, (uint)objn, &sym))
    {
        memcpy(buf, sym.toksnam, (size_t)sym.tokslen);
        buf[sym.tokslen] = '\0';
        return;
    }

    strcpy(buf, "<UNKNOWN>");
}